

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

bool __thiscall bssl::cbb_add_hex_consttime(bssl *this,CBB *cbb,Span<const_unsigned_char> in)

{
  byte bVar1;
  uint8_t uVar2;
  int iVar3;
  uchar *puVar4;
  uint8_t *out;
  uint8_t *local_30;
  
  iVar3 = CBB_add_space((CBB *)this,&local_30,(long)in.data_ * 2);
  if (iVar3 != 0) {
    for (puVar4 = (uchar *)0x0; in.data_ != puVar4; puVar4 = puVar4 + 1) {
      bVar1 = puVar4[(long)&cbb->child];
      uVar2 = hex_char_consttime(bVar1 >> 4);
      *local_30 = uVar2;
      local_30 = local_30 + 1;
      uVar2 = hex_char_consttime(bVar1 & 0xf);
      *local_30 = uVar2;
      local_30 = local_30 + 1;
    }
  }
  return iVar3 != 0;
}

Assistant:

static bool cbb_add_hex_consttime(CBB *cbb, Span<const uint8_t> in) {
  uint8_t *out;
  if (!CBB_add_space(cbb, &out, in.size() * 2)) {
    return false;
  }

  for (uint8_t b : in) {
    *(out++) = hex_char_consttime(b >> 4);
    *(out++) = hex_char_consttime(b & 0xf);
  }

  return true;
}